

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

void __thiscall Nova::Driver<float,_3>::Write_Time(Driver<float,_3> *this,int frame)

{
  undefined8 *puVar1;
  Example<float,_3> *pEVar2;
  pointer pcVar3;
  uint uVar4;
  undefined8 *puVar5;
  long *plVar6;
  ostream *poVar7;
  uint uVar8;
  size_type *psVar9;
  ulong uVar10;
  uint __val;
  uint __len;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  string local_50;
  
  pEVar2 = this->example;
  if (pEVar2->write_time != true) {
    return;
  }
  pcVar3 = (pEVar2->output_directory)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (pEVar2->output_directory)._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  __val = -frame;
  if (0 < frame) {
    __val = frame;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_00128ae3;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_00128ae3;
      }
      if (uVar8 < 10000) goto LAB_00128ae3;
      uVar10 = uVar10 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_00128ae3:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)__len - (char)(frame >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)frame >> 0x1f) + (long)local_90),__len,__val);
  uVar10 = 0xf;
  if (local_70 != local_60) {
    uVar10 = local_60[0];
  }
  if (uVar10 < (ulong)(local_88 + local_68)) {
    uVar10 = 0xf;
    if (local_90 != local_80) {
      uVar10 = local_80[0];
    }
    if ((ulong)(local_88 + local_68) <= uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      goto LAB_00128b6f;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
LAB_00128b6f:
  local_b0 = &local_a0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar5[3];
  }
  else {
    local_a0 = *puVar1;
    local_b0 = (undefined8 *)*puVar5;
  }
  local_a8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_50.field_2._M_allocated_capacity = *psVar9;
    local_50.field_2._8_8_ = plVar6[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar9;
    local_50._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_50._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar7 = File_Utilities::Safe_Open_Output(&local_50,true);
  std::ostream::write((char *)poVar7,(long)&this->time);
  (**(code **)(*(long *)poVar7 + 8))(poVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void Driver<T,d>::
Write_Time(const int frame) const
{
    if(example.write_time) File_Utilities::Write_To_File<T>(example.output_directory+"/"+std::to_string(frame)+"/time",time);
}